

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall absl::SimpleAtob(absl *this,string_view str,bool *value)

{
  undefined1 uVar1;
  int iVar2;
  char *len;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  
  len = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    SimpleAtob();
  }
  string_view::string_view(&local_30,"true");
  if (((((((char *)local_30.length_ == len) &&
         (iVar2 = strings_internal::memcasecmp((char *)this,local_30.ptr_,(size_t)len), iVar2 == 0))
        || ((string_view::string_view(&local_40,"t"), (char *)local_40.length_ == len &&
            (iVar2 = strings_internal::memcasecmp((char *)this,local_40.ptr_,(size_t)len),
            iVar2 == 0)))) ||
       ((string_view::string_view(&local_50,"yes"), (char *)local_50.length_ == len &&
        (iVar2 = strings_internal::memcasecmp((char *)this,local_50.ptr_,(size_t)len), iVar2 == 0)))
       ) || ((string_view::string_view(&local_60,"y"), (char *)local_60.length_ == len &&
             (iVar2 = strings_internal::memcasecmp((char *)this,local_60.ptr_,(size_t)len),
             iVar2 == 0)))) ||
     ((string_view::string_view(&local_70,"1"), (char *)local_70.length_ == len &&
      (iVar2 = strings_internal::memcasecmp((char *)this,local_70.ptr_,(size_t)len), iVar2 == 0))))
  {
    uVar1 = 1;
  }
  else {
    string_view::string_view(&local_80,"false");
    if (((((char *)local_80.length_ == len) &&
         (iVar2 = strings_internal::memcasecmp((char *)this,local_80.ptr_,(size_t)len), iVar2 == 0))
        || ((string_view::string_view(&local_90,"f"), (char *)local_90.length_ == len &&
            (iVar2 = strings_internal::memcasecmp((char *)this,local_90.ptr_,(size_t)len),
            iVar2 == 0)))) ||
       (((string_view::string_view(&local_a0,"no"), (char *)local_a0.length_ == len &&
         (iVar2 = strings_internal::memcasecmp((char *)this,local_a0.ptr_,(size_t)len), iVar2 == 0))
        || ((string_view::string_view(&local_b0,"n"), (char *)local_b0.length_ == len &&
            (iVar2 = strings_internal::memcasecmp((char *)this,local_b0.ptr_,(size_t)len),
            iVar2 == 0)))))) {
      uVar1 = 0;
    }
    else {
      string_view::string_view(&local_c0,"0");
      if ((char *)local_c0.length_ != len) {
        return false;
      }
      iVar2 = strings_internal::memcasecmp((char *)this,local_c0.ptr_,(size_t)len);
      uVar1 = 0;
      if (iVar2 != 0) {
        return false;
      }
    }
  }
  *(undefined1 *)str.length_ = uVar1;
  return true;
}

Assistant:

bool SimpleAtob(absl::string_view str, bool* value) {
  ABSL_RAW_CHECK(value != nullptr, "Output pointer must not be nullptr.");
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}